

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O1

void __thiscall Function_Pool::FunctionTask::_task(FunctionTask *this,size_t taskId)

{
  InputImageInfo *pIVar1;
  InputImageInfo *pIVar2;
  OutputImageInfo *pOVar3;
  bool bVar4;
  uint32_t uVar5;
  imageException *this_00;
  
  switch(this->functionId) {
  case _none:
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Image function task is not setup");
    goto LAB_001147a7;
  case _AbsoluteDifference:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::AbsoluteDifference
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pIVar1->image,
               *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar1->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4));
    break;
  case _BitwiseAnd:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::BitwiseAnd
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pIVar1->image,
               *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar1->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4));
    break;
  case _BitwiseOr:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::BitwiseOr(pIVar2->image,
                        *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),pIVar1->image,
                        *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar1->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),pOVar3->image,
                        *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pOVar3->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).width.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).height.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4));
    break;
  case _BitwiseXor:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::BitwiseXor
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pIVar1->image,
               *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar1->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4));
    break;
  case _ConvertToGrayScale:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::ConvertToGrayScale
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4));
    break;
  case _ConvertToRgb:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::ConvertToRgb
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4));
    break;
  case _ExtractChannel:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::ExtractChannel
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),(this->_dataIn).extractChannelId);
  case _GammaCorrection:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::GammaCorrection
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),(this->_dataIn).coefficientA,(this->_dataIn).coefficientGamma);
    break;
  case _Histogram:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    penguinV::Histogram(pIVar2->image,
                        *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).width.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).height.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        (this->_dataOut).histogram.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + taskId);
    return;
  case _Invert:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::Invert(pIVar2->image,
                     *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pIVar2->super_AreaInfo).startY.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),pOVar3->image,
                     *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pOVar3->super_AreaInfo).startY.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pIVar2->super_AreaInfo).width.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pIVar2->super_AreaInfo).height.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4));
    break;
  case _IsEqual:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    bVar4 = penguinV::IsEqual(pIVar2->image,
                              *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                              *(uint32_t *)
                               (*(long *)&(pIVar2->super_AreaInfo).startY.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl + taskId * 4),pIVar1->image,
                              *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
                              *(uint32_t *)
                               (*(long *)&(pIVar1->super_AreaInfo).startY.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl + taskId * 4),
                              *(uint32_t *)
                               (*(long *)&(pIVar2->super_AreaInfo).width.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl + taskId * 4),
                              *(uint32_t *)
                               (*(long *)&(pIVar2->super_AreaInfo).height.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl + taskId * 4));
    (this->_dataOut).equality.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[taskId] = bVar4;
    break;
  case _LookupTable:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::LookupTable
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),pOVar3->image,
               *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pOVar3->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),&(this->_dataIn).lookupTable);
    break;
  case _Maximum:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::Maximum(pIVar2->image,
                      *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar2->super_AreaInfo).startY.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),pIVar1->image,
                      *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar1->super_AreaInfo).startY.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),pOVar3->image,
                      *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pOVar3->super_AreaInfo).startY.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar2->super_AreaInfo).width.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar2->super_AreaInfo).height.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4));
    break;
  case _Minimum:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::Minimum(pIVar2->image,
                      *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar2->super_AreaInfo).startY.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),pIVar1->image,
                      *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar1->super_AreaInfo).startY.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),pOVar3->image,
                      *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pOVar3->super_AreaInfo).startY.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar2->super_AreaInfo).width.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4),
                      *(uint32_t *)
                       (*(long *)&(pIVar2->super_AreaInfo).height.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + taskId * 4));
    break;
  case _ProjectionProfile:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    penguinV::ProjectionProfile
              (pIVar2->image,*(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).startY.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).width.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),
               *(uint32_t *)
                (*(long *)&(pIVar2->super_AreaInfo).height.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                taskId * 4),(this->_dataIn).horizontalProjection,
               (this->_dataOut).projection.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + taskId);
    break;
  case _Resize:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::Resize(pIVar2->image,
                     *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pIVar2->super_AreaInfo).startY.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pIVar2->super_AreaInfo).width.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pIVar2->super_AreaInfo).height.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),pOVar3->image,
                     *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pOVar3->super_AreaInfo).startY.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pOVar3->super_AreaInfo).width.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4),
                     *(uint32_t *)
                      (*(long *)&(pOVar3->super_AreaInfo).height.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + taskId * 4));
    break;
  case _RgbToBgr:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::RgbToBgr(pIVar2->image,
                       *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pIVar2->super_AreaInfo).startY.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4),pOVar3->image,
                       *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pOVar3->super_AreaInfo).startY.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pIVar2->super_AreaInfo).width.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pIVar2->super_AreaInfo).height.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4));
    break;
  case _Subtract:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pIVar1 = (this->super_FunctionPoolTask)._infoIn2._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::Subtract(pIVar2->image,
                       *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pIVar2->super_AreaInfo).startY.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4),pIVar1->image,
                       *(uint32_t *)(*(long *)&(pIVar1->super_AreaInfo).startX + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pIVar1->super_AreaInfo).startY.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4),pOVar3->image,
                       *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pOVar3->super_AreaInfo).startY.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pIVar2->super_AreaInfo).width.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4),
                       *(uint32_t *)
                        (*(long *)&(pIVar2->super_AreaInfo).height.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + taskId * 4));
    break;
  case _Sum:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    uVar5 = penguinV::Sum(pIVar2->image,
                          *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                          *(uint32_t *)
                           (*(long *)&(pIVar2->super_AreaInfo).startY.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + taskId * 4),
                          *(uint32_t *)
                           (*(long *)&(pIVar2->super_AreaInfo).width.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + taskId * 4),
                          *(uint32_t *)
                           (*(long *)&(pIVar2->super_AreaInfo).height.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + taskId * 4));
    (this->_dataOut).sum.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[taskId] = uVar5;
    break;
  case _Threshold:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::Threshold(pIVar2->image,
                        *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),pOVar3->image,
                        *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pOVar3->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).width.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).height.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),(this->_dataIn).minThreshold);
    break;
  case _ThresholdDouble:
    pIVar2 = (this->super_FunctionPoolTask)._infoIn1._M_t.
             super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    pOVar3 = (this->super_FunctionPoolTask)._infoOut._M_t.
             super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
             .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    penguinV::Threshold(pIVar2->image,
                        *(uint32_t *)(*(long *)&(pIVar2->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),pOVar3->image,
                        *(uint32_t *)(*(long *)&(pOVar3->super_AreaInfo).startX + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pOVar3->super_AreaInfo).startY.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).width.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),
                        *(uint32_t *)
                         (*(long *)&(pIVar2->super_AreaInfo).height.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + taskId * 4),(this->_dataIn).minThreshold,
                        (this->_dataIn).maxThreshold);
    break;
  default:
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Unknown image function task");
LAB_001147a7:
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  return;
}

Assistant:

virtual void _task( size_t taskId )
        {
            switch( functionId ) {
                case _none:
                    throw imageException( "Image function task is not setup" );
                case _AbsoluteDifference:
                    penguinV::AbsoluteDifference(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _BitwiseAnd:
                    penguinV::BitwiseAnd( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                          _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                          _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                          _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _BitwiseOr:
                    penguinV::BitwiseOr( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                         _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _BitwiseXor:
                    penguinV::BitwiseXor( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                          _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                          _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                          _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ConvertToGrayScale:
                    penguinV::ConvertToGrayScale( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                                  _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                                  _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ConvertToRgb:
                    penguinV::ConvertToRgb( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                            _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                            _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ExtractChannel:
                    penguinV::ExtractChannel(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.extractChannelId );
                case _GammaCorrection:
                    penguinV::GammaCorrection(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.coefficientA,
                        _dataIn.coefficientGamma );
                    break;
                case _Histogram:
                    penguinV::Histogram( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId], _dataOut.histogram[taskId] );
                    break;
                case _Invert:
                    penguinV::Invert( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                      _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                      _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _IsEqual:
                    _dataOut.equality[taskId] = penguinV::IsEqual(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _LookupTable:
                    penguinV::LookupTable( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                           _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                           _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.lookupTable );
                    break;
                case _Maximum:
                    penguinV::Maximum( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                       _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                       _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                       _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Minimum:
                    penguinV::Minimum( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                       _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                       _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                       _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ProjectionProfile:
                    penguinV::ProjectionProfile(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId],
                        _dataIn.horizontalProjection, _dataOut.projection[taskId] );
                    break;
                case _Resize:
                    penguinV::Resize( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                      _infoIn1->width[taskId], _infoIn1->height[taskId],
                                      _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                      _infoOut->width[taskId], _infoOut->height[taskId] );
                    break;
                case _RgbToBgr:
                    penguinV::RgbToBgr( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Subtract:
                    penguinV::Subtract( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                        _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Sum:
                    _dataOut.sum[taskId] = penguinV::Sum(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Threshold:
                    penguinV::Threshold( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.minThreshold );
                    break;
                case _ThresholdDouble:
                    penguinV::Threshold( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.minThreshold,
                                         _dataIn.maxThreshold );
                    break;
                default:
                    throw imageException( "Unknown image function task" );
            }
        }